

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::render::text(cvui_block_t *theBlock,String *theText,Point *thePos,double theFontScale,
                       uint theColor)

{
  double dVar1;
  Point *pPVar2;
  Scalar local_80;
  Point_<int> local_50;
  _InputOutputArray local_48;
  uint local_2c;
  double dStack_28;
  uint theColor_local;
  double theFontScale_local;
  Point *thePos_local;
  String *theText_local;
  cvui_block_t *theBlock_local;
  
  local_2c = theColor;
  dStack_28 = theFontScale;
  theFontScale_local = (double)thePos;
  thePos_local = (Point *)theText;
  theText_local = (String *)theBlock;
  cv::_InputOutputArray::_InputOutputArray(&local_48,&theBlock->where);
  pPVar2 = thePos_local;
  cv::Point_<int>::Point_(&local_50,(Point_<int> *)theFontScale_local);
  dVar1 = dStack_28;
  internal::hexToScalar(&local_80,local_2c);
  cv::putText(dVar1,&local_48,pPVar2,&local_50,0,&local_80,1,0x10,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_48);
  return;
}

Assistant:

void text(cvui_block_t& theBlock, const cv::String& theText, cv::Point& thePos, double theFontScale, unsigned int theColor) {
		cv::putText(theBlock.where, theText, thePos, cv::FONT_HERSHEY_SIMPLEX, theFontScale, internal::hexToScalar(theColor), 1, CVUI_ANTIALISED);
	}